

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

bool IsOpSuccess(opcodetype *opcode)

{
  int *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_12;
  undefined1 local_11;
  
  local_11 = true;
  if ((((*in_RDI != 0x50) && (local_11 = true, *in_RDI != 0x62)) &&
      ((*in_RDI < 0x7e || (local_11 = true, 0x81 < *in_RDI)))) &&
     ((((*in_RDI < 0x83 || (local_11 = true, 0x86 < *in_RDI)) &&
       ((*in_RDI < 0x89 || (local_11 = true, 0x8a < *in_RDI)))) &&
      (((*in_RDI < 0x8d || (local_11 = true, 0x8e < *in_RDI)) &&
       ((*in_RDI < 0x95 || (local_11 = true, 0x99 < *in_RDI)))))))) {
    local_12 = false;
    if (0xba < *in_RDI) {
      local_12 = *in_RDI < 0xff;
    }
    local_11 = local_12;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool IsOpSuccess(const opcodetype& opcode)
{
    return opcode == 80 || opcode == 98 || (opcode >= 126 && opcode <= 129) ||
           (opcode >= 131 && opcode <= 134) || (opcode >= 137 && opcode <= 138) ||
           (opcode >= 141 && opcode <= 142) || (opcode >= 149 && opcode <= 153) ||
           (opcode >= 187 && opcode <= 254);
}